

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O1

Spot * board_spotGet(Board *board,SPOTTYPE spotType,uchar spotIndex)

{
  Spot *pSVar1;
  ulong uVar2;
  
  if ((ulong)board->spotsCount != 0) {
    uVar2 = 0;
    do {
      pSVar1 = board->spots[uVar2];
      if ((pSVar1->type == spotType) && (pSVar1->index == spotIndex)) {
        return pSVar1;
      }
      uVar2 = uVar2 + 1;
    } while (board->spotsCount != uVar2);
  }
  return (Spot *)0x0;
}

Assistant:

Spot * board_spotGet(Board * board, SPOTTYPE spotType, unsigned char spotIndex)
{
	unsigned char i;
	Spot * spot;

	for(i=0;i<board->spotsCount;i++)
	{
		spot = board->spots[i];

		if(spot->type==spotType && spot->index==spotIndex)
			return spot;
	}

	return 0;
}